

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

Regexp * re2::Regexp::LiteralString(Rune *runes,int nrunes,ParseFlags flags)

{
  Rune RVar1;
  Regexp *this;
  uint16_t uVar2;
  ulong uVar3;
  
  uVar2 = (uint16_t)flags;
  if (nrunes < 1) {
    this = (Regexp *)operator_new(0x28);
    this->op_ = '\x02';
    this->simple_ = '\0';
    this->parse_flags_ = uVar2;
    this->ref_ = 1;
    *(undefined8 *)&this->nsub_ = 0;
    *(undefined8 *)((long)&this->field_5 + 6) = 0;
    *(undefined8 *)((long)&this->down_ + 6) = 0;
    *(undefined8 *)((long)&(this->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&this->field_7 + 0xe) = 0;
  }
  else if (nrunes == 1) {
    RVar1 = *runes;
    this = (Regexp *)operator_new(0x28);
    this->op_ = '\x03';
    this->simple_ = '\0';
    this->parse_flags_ = uVar2;
    this->ref_ = 1;
    *(undefined8 *)((long)&this->down_ + 6) = 0;
    *(undefined8 *)((long)&(this->field_7).field_3.cc_ + 6) = 0;
    *(undefined8 *)&this->nsub_ = 0;
    *(undefined8 *)((long)&this->field_5 + 6) = 0;
    *(undefined2 *)((long)&this->field_7 + 0xe) = 0;
    (this->field_7).rune_ = RVar1;
  }
  else {
    this = (Regexp *)operator_new(0x28);
    this->op_ = '\x04';
    this->simple_ = '\0';
    this->parse_flags_ = uVar2;
    this->ref_ = 1;
    *(undefined8 *)&this->nsub_ = 0;
    *(undefined8 *)((long)&this->field_5 + 6) = 0;
    *(undefined8 *)((long)&this->down_ + 6) = 0;
    *(undefined8 *)((long)&(this->field_7).field_3.cc_ + 6) = 0;
    *(undefined2 *)((long)&this->field_7 + 0xe) = 0;
    uVar3 = 0;
    do {
      AddRuneToString(this,runes[uVar3]);
      uVar3 = uVar3 + 1;
    } while ((uint)nrunes != uVar3);
  }
  return this;
}

Assistant:

Regexp* Regexp::LiteralString(Rune* runes, int nrunes, ParseFlags flags) {
  if (nrunes <= 0)
    return new Regexp(kRegexpEmptyMatch, flags);
  if (nrunes == 1)
    return NewLiteral(runes[0], flags);
  Regexp* re = new Regexp(kRegexpLiteralString, flags);
  for (int i = 0; i < nrunes; i++)
    re->AddRuneToString(runes[i]);
  return re;
}